

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file.cc
# Opt level: O2

vector<unsigned_char,_std::allocator<unsigned_char>_> *
ReadBinaryFile(vector<unsigned_char,_std::allocator<unsigned_char>_> *__return_storage_ptr__,
              string *file)

{
  runtime_error *this;
  istreambuf_iterator<char,_std::char_traits<char>_> __first;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_268;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_248;
  ifstream in;
  int aiStack_208 [50];
  undefined8 auStack_140 [36];
  
  std::ifstream::ifstream(&in,(string *)file,_S_bin);
  if (*(int *)((long)aiStack_208 + *(long *)(_in + -0x18)) == 0) {
    __first._8_8_ = 0xffffffffffffffff;
    __first._M_sbuf = *(streambuf_type **)((long)auStack_140 + *(long *)(_in + -0x18));
    std::vector<unsigned_char,std::allocator<unsigned_char>>::
    vector<std::istreambuf_iterator<char,std::char_traits<char>>,void>
              ((vector<unsigned_char,std::allocator<unsigned_char>> *)__return_storage_ptr__,__first
               ,(istreambuf_iterator<char,_std::char_traits<char>_>)(ZEXT816(0xffffffff) << 0x40),
               (allocator_type *)&bStack_268);
    std::ifstream::~ifstream(&in);
    return __return_storage_ptr__;
  }
  this = (runtime_error *)__cxa_allocate_exception(0x10);
  s_abi_cxx11_(&local_248,"Failed to open file: ",0x15);
  std::operator+(&bStack_268,&local_248,file);
  std::runtime_error::runtime_error(this,(string *)&bStack_268);
  __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

std::vector<uint8_t> ReadBinaryFile(std::string const& file) {
  std::ifstream in(file, std::ios_base::binary);
  if (!in.good()) {
    throw std::runtime_error("Failed to open file: "s + file);
  }

  return std::vector<uint8_t>(std::istreambuf_iterator<char>(in),
                              std::istreambuf_iterator<char>());
}